

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall CVmObjDict::apply_undo(CVmObjDict *this,CVmUndoRecord *undo_rec)

{
  int iVar1;
  int *__ptr;
  dict_undo_rec *rec;
  
  __ptr = (int *)(undo_rec->id).ptrval;
  if (__ptr != (int *)0x0) {
    iVar1 = *__ptr;
    if (iVar1 == 2) {
      set_comparator(this,__ptr[1]);
    }
    else if (iVar1 == 1) {
      add_hash_entry(this,(char *)(__ptr + 6),*(size_t *)(__ptr + 4),1,__ptr[1],
                     *(vm_prop_id_t *)(__ptr + 2),0);
    }
    else if (iVar1 == 0) {
      del_hash_entry(this,(char *)(__ptr + 6),*(size_t *)(__ptr + 4),__ptr[1],
                     *(vm_prop_id_t *)(__ptr + 2));
    }
    free(__ptr);
    (undo_rec->id).ptrval = (void *)0x0;
  }
  return;
}

Assistant:

void CVmObjDict::apply_undo(VMG_ CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        dict_undo_rec *rec;

        /* get my undo record */
        rec = (dict_undo_rec *)undo_rec->id.ptrval;

        /* take the appropriate action */
        switch(rec->action)
        {
        case DICT_UNDO_ADD:
            /* we added the word, so we must now delete it */
            del_hash_entry(vmg_ rec->txt, rec->len, rec->obj, rec->prop);
            break;

        case DICT_UNDO_DEL:
            /* we deleted the word, so now we must add it */
            add_hash_entry(vmg_ rec->txt, rec->len, TRUE,
                           rec->obj, rec->prop, FALSE);
            break;

        case DICT_UNDO_COMPARATOR:
            /* we changed the comparator object, so change it back */
            set_comparator(vmg_ rec->obj);
            break;
        }

        /* discard my record */
        t3free(rec);

        /* clear the pointer in the undo record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}